

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_op<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,int dim,float coeff)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  int *piVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  size_t __size;
  uint uVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  size_t sVar22;
  uint uVar23;
  int iVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  
  uVar3 = a->w;
  uVar8 = (ulong)uVar3;
  uVar4 = a->h;
  sVar22 = (size_t)(int)uVar3;
  uVar13 = a->c;
  uVar9 = (ulong)uVar13;
  sVar12 = (size_t)(int)uVar13;
  uVar23 = uVar4 * uVar3;
  if (dim == 0) {
    if (((b->dims != 1) || (b->w != 1)) || (b->elemsize != 4)) {
      piVar6 = b->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if ((*piVar6 == 0) && (b->data != (void *)0x0)) {
          free(*(void **)((long)b->data + -8));
        }
      }
      b->elemsize = 0;
      b->dims = 0;
      b->w = 0;
      b->h = 0;
      b->c = 0;
      b->cstep = 0;
      b->data = (void *)0x0;
      b->refcount = (int *)0x0;
      b->elemsize = 4;
      b->dims = 1;
      b->w = 1;
      b->h = 1;
      b->c = 1;
      b->cstep = 1;
      pvVar5 = malloc(0x20);
      lVar20 = 4;
LAB_001177c2:
      pvVar7 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar7 - 8) = pvVar5;
      b->data = pvVar7;
      b->refcount = (int *)((long)pvVar7 + lVar20);
      *(undefined4 *)((long)pvVar7 + lVar20) = 1;
    }
  }
  else {
    switch(dim) {
    case 1:
      if (((b->dims != 1) || (b->w != uVar13)) || (b->elemsize != 4)) {
        piVar6 = b->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if ((*piVar6 == 0) && (b->data != (void *)0x0)) {
            free(*(void **)((long)b->data + -8));
          }
        }
        *(undefined4 *)&b->elemsize = 0;
        *(undefined4 *)((long)&b->elemsize + 4) = 0;
        b->dims = 0;
        b->w = 0;
        b->h = 0;
        b->c = 0;
        *(undefined4 *)&b->cstep = 0;
        *(undefined4 *)((long)&b->cstep + 4) = 0;
        *(undefined4 *)&b->data = 0;
        *(undefined4 *)((long)&b->data + 4) = 0;
        *(undefined4 *)&b->refcount = 0;
        *(undefined4 *)((long)&b->refcount + 4) = 0;
        b->elemsize = 4;
        b->dims = 1;
        b->w = uVar13;
        b->h = 1;
        b->c = 1;
        b->cstep = sVar12;
        if (uVar13 != 0) {
          lVar20 = sVar12 * 4;
          __size = sVar12 * 4 + 0x1c;
          goto LAB_001177bd;
        }
      }
      break;
    case 2:
      if (((b->dims != 2) || (b->w != uVar4)) || ((b->h != uVar13 || (b->elemsize != 4)))) {
        piVar6 = b->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if ((*piVar6 == 0) && (b->data != (void *)0x0)) {
            free(*(void **)((long)b->data + -8));
          }
        }
        b->elemsize = 0;
        b->dims = 0;
        b->w = 0;
        b->h = 0;
        b->c = 0;
        b->cstep = 0;
        b->data = (void *)0x0;
        b->refcount = (int *)0x0;
        b->elemsize = 4;
        b->dims = 2;
        b->w = uVar4;
        b->h = uVar13;
        b->c = 1;
        uVar34 = uVar13 * uVar4;
        goto LAB_00117793;
      }
      break;
    case -2:
      if ((((b->dims != 2) || (b->w != uVar3)) || (b->h != uVar4)) || (b->elemsize != 4)) {
        piVar6 = b->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if ((*piVar6 == 0) && (b->data != (void *)0x0)) {
            free(*(void **)((long)b->data + -8));
          }
        }
        b->elemsize = 0;
        b->dims = 0;
        b->w = 0;
        b->h = 0;
        b->c = 0;
        b->cstep = 0;
        b->data = (void *)0x0;
        b->refcount = (int *)0x0;
        b->elemsize = 4;
        b->dims = 2;
        b->w = uVar3;
        b->h = uVar4;
        b->c = 1;
        uVar34 = uVar23;
LAB_00117793:
        sVar21 = (size_t)(int)uVar34;
        b->cstep = sVar21;
        if (uVar34 != 0) {
          __size = sVar21 * 4 + 0x1c;
          lVar20 = sVar21 << 2;
LAB_001177bd:
          pvVar5 = malloc(__size);
          goto LAB_001177c2;
        }
      }
      break;
    case -1:
      if (((b->dims != 1) || (b->w != uVar3)) || (b->elemsize != 4)) {
        piVar6 = b->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if ((*piVar6 == 0) && (b->data != (void *)0x0)) {
            free(*(void **)((long)b->data + -8));
          }
        }
        *(undefined4 *)&b->elemsize = 0;
        *(undefined4 *)((long)&b->elemsize + 4) = 0;
        b->dims = 0;
        b->w = 0;
        b->h = 0;
        b->c = 0;
        *(undefined4 *)&b->cstep = 0;
        *(undefined4 *)((long)&b->cstep + 4) = 0;
        *(undefined4 *)&b->data = 0;
        *(undefined4 *)((long)&b->data + 4) = 0;
        *(undefined4 *)&b->refcount = 0;
        *(undefined4 *)((long)&b->refcount + 4) = 0;
        b->elemsize = 4;
        b->dims = 1;
        b->w = uVar3;
        b->h = 1;
        b->c = 1;
        b->cstep = sVar22;
        if (uVar3 != 0) {
          lVar20 = sVar22 * 4;
          __size = sVar22 * 4 + 0x1c;
          goto LAB_001177bd;
        }
      }
    }
  }
  if (b->data == (void *)0x0) {
    return -100;
  }
  if ((long)b->c * b->cstep == 0) {
    return -100;
  }
  if (dim == 0) {
    if (uVar13 == 0) {
      uVar8 = 0;
      piVar6 = (int *)0x0;
    }
    else {
      pvVar5 = malloc(sVar12 * 4 + 0x1c);
      uVar8 = (long)pvVar5 + 0x17U & 0xfffffffffffffff0;
      *(void **)(uVar8 - 8) = pvVar5;
      piVar6 = (int *)(uVar8 + sVar12 * 4);
      *(undefined4 *)(uVar8 + sVar12 * 4) = 1;
    }
    if (uVar13 == 0 || uVar8 == 0) {
      if (piVar6 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (uVar8 == 0 || *piVar6 != 0) {
        return -100;
      }
      pvVar5 = *(void **)(uVar8 - 8);
LAB_00117be4:
      free(pvVar5);
      return -100;
    }
    if (0 < (int)uVar13) {
      pvVar5 = a->data;
      sVar12 = a->cstep;
      sVar22 = a->elemsize;
      uVar14 = 0;
      do {
        fVar25 = 0.0;
        if (0 < (int)uVar23) {
          uVar16 = 0;
          do {
            fVar25 = fVar25 + *(float *)((long)pvVar5 + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar23 != uVar16);
        }
        *(float *)(uVar8 + uVar14 * 4) = fVar25;
        uVar14 = uVar14 + 1;
        pvVar5 = (void *)((long)pvVar5 + sVar12 * sVar22);
      } while (uVar14 != uVar9);
    }
    fVar25 = 0.0;
    if (0 < (int)uVar13) {
      uVar14 = 0;
      do {
        fVar25 = fVar25 + *(float *)(uVar8 + uVar14 * 4);
        uVar14 = uVar14 + 1;
      } while (uVar9 != uVar14);
    }
    *(float *)b->data = fVar25 * v0;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (uVar8 != 0 && *piVar6 == 0) {
        free(*(void **)(uVar8 - 8));
      }
    }
    if (uVar13 == 0 || uVar8 == 0) {
      return -100;
    }
  }
  else {
    switch(dim) {
    case 1:
      if (0 < (int)uVar13) {
        sVar12 = a->cstep;
        sVar22 = a->elemsize;
        pvVar5 = a->data;
        pvVar7 = b->data;
        uVar8 = 0;
        do {
          fVar25 = 0.0;
          if (0 < (int)uVar23) {
            uVar14 = 0;
            do {
              fVar25 = fVar25 + *(float *)((long)pvVar5 + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar23 != uVar14);
          }
          *(float *)((long)pvVar7 + uVar8 * 4) = fVar25 * v0;
          uVar8 = uVar8 + 1;
          pvVar5 = (void *)((long)pvVar5 + sVar12 * sVar22);
        } while (uVar8 != uVar9);
      }
      break;
    case 2:
      if (0 < (int)uVar13) {
        pvVar5 = a->data;
        sVar12 = a->cstep;
        sVar21 = a->elemsize;
        pvVar7 = b->data;
        sVar1 = b->cstep;
        sVar2 = b->elemsize;
        uVar13 = uVar3 - 1;
        uVar8 = 0;
        do {
          if (0 < (int)uVar4) {
            pvVar18 = (void *)(sVar12 * sVar21 * uVar8 + (long)pvVar5);
            uVar14 = 0;
            do {
              if ((int)uVar3 < 1) {
                fVar25 = 0.0;
              }
              else {
                fVar25 = *(float *)((long)pvVar18 + uVar14 * 4);
                fVar27 = 0.0;
                fVar29 = 0.0;
                fVar31 = 0.0;
                fVar33 = 0.0;
                iVar10 = 4;
                do {
                  fVar32 = fVar33;
                  fVar30 = fVar31;
                  fVar28 = fVar29;
                  fVar26 = fVar27;
                  fVar27 = fVar25 + fVar26;
                  fVar29 = fVar25 + fVar28;
                  fVar31 = fVar25 + fVar30;
                  fVar33 = fVar25 + fVar32;
                  iVar11 = iVar10 + -4;
                  iVar24 = iVar10 + (uVar3 + 3 & 0xfffffffc);
                  iVar10 = iVar11;
                } while (iVar24 != 8);
                uVar23 = -iVar11;
                uVar34 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)(uVar23 ^ 0x80000000));
                uVar35 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar23 | 1) ^ 0x80000000));
                uVar36 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar23 | 2) ^ 0x80000000));
                uVar23 = -(uint)((int)(uVar13 ^ 0x80000000) < (int)((uVar23 | 3) ^ 0x80000000));
                fVar25 = (float)(~uVar23 & (uint)fVar33 | (uint)fVar32 & uVar23) +
                         (float)(~uVar35 & (uint)fVar29 | (uint)fVar28 & uVar35) +
                         (float)(~uVar36 & (uint)fVar31 | (uint)fVar30 & uVar36) +
                         (float)(~uVar34 & (uint)fVar27 | (uint)fVar26 & uVar34);
              }
              *(float *)((long)pvVar7 + uVar14 * 4 + sVar1 * sVar2 * uVar8) = fVar25 * v0;
              pvVar18 = (void *)((long)pvVar18 + sVar22 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar4);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar9);
      }
      break;
    case -2:
      uVar3 = b->c * (int)b->cstep;
      if (0 < (int)uVar3) {
        memset(b->data,0,(ulong)uVar3 << 2);
      }
      if (0 < (int)uVar13) {
        sVar12 = a->cstep;
        sVar22 = a->elemsize;
        pvVar5 = a->data;
        pvVar7 = b->data;
        uVar8 = 0;
        do {
          if (0 < (int)uVar23) {
            uVar14 = 0;
            do {
              *(float *)((long)pvVar7 + uVar14 * 4) =
                   *(float *)((long)pvVar5 + uVar14 * 4) + *(float *)((long)pvVar7 + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar23 != uVar14);
          }
          uVar8 = uVar8 + 1;
          pvVar5 = (void *)((long)pvVar5 + sVar12 * sVar22);
        } while (uVar8 != uVar9);
      }
      if (0 < (int)uVar23) {
        pvVar5 = b->data;
        uVar9 = 0;
        do {
          *(float *)((long)pvVar5 + uVar9 * 4) = *(float *)((long)pvVar5 + uVar9 * 4) * v0;
          uVar9 = uVar9 + 1;
        } while (uVar23 != uVar9);
      }
      break;
    case -1:
      uVar14 = sVar22 + 3 & 0x3ffffffffffffffc;
      lVar20 = sVar12 * uVar14;
      if (lVar20 == 0) {
        pvVar5 = (void *)0x0;
        piVar6 = (int *)0x0;
      }
      else {
        pvVar7 = malloc(lVar20 * 4 + 0x1c);
        pvVar5 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar5 - 8) = pvVar7;
        piVar6 = (int *)((long)pvVar5 + lVar20 * 4);
        *piVar6 = 1;
      }
      if (lVar20 == 0 || pvVar5 == (void *)0x0) {
        if (piVar6 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (pvVar5 == (void *)0x0 || *piVar6 != 0) {
          return -100;
        }
        pvVar5 = *(void **)((long)pvVar5 + -8);
        goto LAB_00117be4;
      }
      uVar23 = uVar13 * (int)uVar14;
      if (0 < (int)uVar23) {
        memset(pvVar5,0,(ulong)uVar23 << 2);
      }
      if (0 < (int)uVar13) {
        sVar12 = a->cstep;
        sVar21 = a->elemsize;
        pvVar7 = a->data;
        uVar16 = 0;
        pvVar18 = pvVar5;
        do {
          if (0 < (int)uVar4) {
            pvVar15 = (void *)(sVar12 * sVar21 * uVar16 + (long)pvVar7);
            uVar17 = 0;
            do {
              if (0 < (int)uVar3) {
                uVar19 = 0;
                do {
                  *(float *)((long)pvVar18 + uVar19 * 4) =
                       *(float *)((long)pvVar15 + uVar17 * 4) +
                       *(float *)((long)pvVar18 + uVar19 * 4);
                  uVar19 = uVar19 + 1;
                } while (uVar8 != uVar19);
              }
              pvVar15 = (void *)((long)pvVar15 + sVar22 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar4);
          }
          uVar16 = uVar16 + 1;
          pvVar18 = (void *)((long)pvVar18 + uVar14 * 4);
        } while (uVar16 != uVar9);
      }
      uVar4 = b->c * (int)b->cstep;
      if (0 < (int)uVar4) {
        memset(b->data,0,(ulong)uVar4 << 2);
      }
      if (0 < (int)uVar13) {
        pvVar7 = b->data;
        uVar16 = 0;
        pvVar18 = pvVar5;
        do {
          if (0 < (int)uVar3) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar7 + uVar17 * 4) =
                   *(float *)((long)pvVar18 + uVar17 * 4) + *(float *)((long)pvVar7 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar8 != uVar17);
          }
          uVar16 = uVar16 + 1;
          pvVar18 = (void *)((long)pvVar18 + uVar14 * 4);
        } while (uVar16 != uVar9);
      }
      if (0 < (int)uVar3) {
        pvVar7 = b->data;
        uVar9 = 0;
        do {
          *(float *)((long)pvVar7 + uVar9 * 4) = *(float *)((long)pvVar7 + uVar9 * 4) * v0;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (pvVar5 != (void *)0x0 && *piVar6 == 0) {
          free(*(void **)((long)pvVar5 + -8));
        }
      }
      if (lVar20 == 0 || pvVar5 == (void *)0x0) {
        return -100;
      }
    }
  }
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, int dim, float coeff)
{
    Op op;
    Op2 op2;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    if (dim == 0)
    {
        // w h c -> X X X
        b.create(1);
    }
    else if (dim == 1)
    {
        // w h c -> X X c
        b.create(channels);
    }
    else if (dim == 2)
    {
        // w h c -> X h c
        b.create(h, channels);
    }
    else if (dim == -1)
    {
        // w h c -> w X X
        b.create(w);
    }
    else if (dim == -2)
    {
        // w h c -> w h X
        b.create(w, h);
    }
    if (b.empty())
        return -100;

    if (dim == 0)
    {
        Mat sums(channels);
        if (sums.empty())
            return -100;

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            sums[q] = sum;
        }

        float sum = v0;
        for (int i=0; i<channels; i++)
        {
            sum = op2(sum, sums[i]);
        }

        b[0] = sum * coeff;
    }
    else if (dim == 1)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            float sum = v0;
            for (int i=0; i<size; i++)
            {
                sum = op(sum, ptr[i]);
            }

            b[q] = sum * coeff;
        }
    }
    else if (dim == 2)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = b.channel(q);

            for (int i=0; i<h; i++)
            {
                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[i] = sum * coeff;

                ptr += w;
            }
        }
    }
    else if (dim == -1)
    {
        Mat mins(w, 1, channels);
        if (mins.empty())
            return -100;

        mins.fill(v0);

        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);
            float* mins_ptr = mins.channel(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    mins_ptr[j] = op(mins_ptr[j], ptr[i]);
                }

                ptr += w;
            }
        }

        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* mins_ptr = mins.channel(q);
            for (int j=0; j<w; j++)
            {
                b[j] = op2(b[j], mins_ptr[j]);
            }
        }

        for (int j=0; j<w; j++)
        {
            b[j] *= coeff;
        }
    }
    else if (dim == -2)
    {
        b.fill(v0);

        for (int q=0; q<channels; q++)
        {
            const float* ptr = a.channel(q);

            for (int i=0; i<size; i++)
            {
                b[i] = op(b[i], ptr[i]);
            }
        }

        for (int i=0; i<size; i++)
        {
            b[i] *= coeff;
        }
    }

    return 0;
}